

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O0

void from_file(string *filename)

{
  byte bVar1;
  undefined1 auVar2 [16];
  string local_2a0 [48];
  undefined1 local_270 [8];
  context c;
  string buf;
  ifstream local_218 [8];
  ifstream f;
  string *filename_local;
  
  std::ifstream::ifstream(local_218,filename,8);
  std::__cxx11::string::string((string *)&c._M_h._M_single_bucket);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                   *)local_270);
  stdlib::init_stdlib((unordered_map *)local_270);
  while( true ) {
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) break;
    read_exp(local_218,(string *)&c._M_h._M_single_bucket);
    std::__cxx11::string::string(local_2a0,(string *)&c._M_h._M_single_bucket);
    auVar2 = parser::parse(local_2a0);
    eval::eval(auVar2._0_8_,(thing *)local_270,auVar2._8_8_);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::clear();
  }
  std::ifstream::close();
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                    *)local_270);
  std::__cxx11::string::~string((string *)&c._M_h._M_single_bucket);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void from_file(const std::string &filename) {

  std::ifstream f(filename);
  std::string buf;

  context c;
  stdlib::init_stdlib(c);

  while (f.good()) {

    read_exp(f, buf);
    eval::eval(parser::parse(buf), c);
    buf.clear();

  }

  f.close();

}